

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memjrnlClose(sqlite3_file *pJfd)

{
  MemJournal *p;
  sqlite3_file *pJfd_local;
  
  memjrnlFreeChunks((MemJournal *)pJfd);
  return 0;
}

Assistant:

static int memjrnlClose(sqlite3_file *pJfd){
  MemJournal *p = (MemJournal *)pJfd;
  memjrnlFreeChunks(p);
  return SQLITE_OK;
}